

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void createFloorGridMesh(void)

{
  PFNGLBUFFERDATAPROC p_Var1;
  size_t sVar2;
  vec<3,_float,_(glm::qualifier)0> *pvVar3;
  int local_140 [2];
  float local_138;
  int local_134 [2];
  float local_12c;
  int local_128 [2];
  float local_120;
  int local_11c [2];
  float local_114;
  float local_110;
  int local_10c [2];
  float local_104;
  int local_100 [2];
  float local_f8;
  int local_f4 [2];
  float local_ec;
  int local_e8 [4];
  int j;
  int i_1;
  float dd;
  int m;
  vec<3,_float,_(glm::qualifier)0> local_c4;
  vec<3,_float,_(glm::qualifier)0> local_b8;
  vec<3,_float,_(glm::qualifier)0> local_ac;
  vec<3,_float,_(glm::qualifier)0> local_a0;
  vec<3,_float,_(glm::qualifier)0> local_94;
  vec<3,_float,_(glm::qualifier)0> local_88;
  vec<3,_float,_(glm::qualifier)0> local_7c;
  int local_70;
  undefined4 local_6c;
  int i;
  float d;
  vec<3,_float,_(glm::qualifier)0> local_5c;
  vec<3,_float,_(glm::qualifier)0> local_50 [2];
  vec<3,_float,_(glm::qualifier)0> local_38;
  undefined4 local_2c;
  undefined1 local_28 [4];
  int n;
  Vector<glm::vec<3,_float,_(glm::qualifier)0>_> verts;
  u32 vbo [2];
  
  (*glad_debug_glGenVertexArrays)(2,&gpu::floorGridVao);
  (*glad_debug_glGenBuffers)(2,(GLuint *)&verts._capacity);
  (*glad_debug_glBindVertexArray)(gpu::floorGridVao);
  (*glad_debug_glBindBuffer)(0x8892,(GLuint)verts._capacity);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::Vector
            ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28);
  local_2c = 0x32;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::reserve
            ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,0x194);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_38,-1,0,0);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,&local_38);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)local_50,1,0,0);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,local_50);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_5c,0,0,-1);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,&local_5c);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>((vec<3,float,(glm::qualifier)0> *)&i,0,0,1);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,
             (vec<3,_float,_(glm::qualifier)0> *)&i);
  local_6c = 0x3ca3d70a;
  for (local_70 = 1; p_Var1 = glad_debug_glBufferData, local_70 < 0x33; local_70 = local_70 + 1) {
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
              ((vec<3,float,(glm::qualifier)0> *)&local_7c,-1,0,(float)local_70 * -0.02);
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,&local_7c);
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
              ((vec<3,float,(glm::qualifier)0> *)&local_88,1,0,(float)local_70 * -0.02);
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,&local_88);
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
              ((vec<3,float,(glm::qualifier)0> *)&local_94,-1,0,(float)local_70 * 0.02);
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,&local_94);
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
              ((vec<3,float,(glm::qualifier)0> *)&local_a0,1,0,(float)local_70 * 0.02);
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,&local_a0);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,int,int>
              ((vec<3,float,(glm::qualifier)0> *)&local_ac,(float)local_70 * -0.02,0,-1);
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,&local_ac);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,int,int>
              ((vec<3,float,(glm::qualifier)0> *)&local_b8,(float)local_70 * -0.02,0,1);
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,&local_b8);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,int,int>
              ((vec<3,float,(glm::qualifier)0> *)&local_c4,(float)local_70 * 0.02,0,-1);
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,&local_c4);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,int,int>
              ((vec<3,float,(glm::qualifier)0> *)&dd,(float)local_70 * 0.02,0,1);
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,
               (vec<3,_float,_(glm::qualifier)0> *)&dd);
  }
  sVar2 = tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                    ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28);
  pvVar3 = tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::data
                     ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28);
  (*p_Var1)(0x8892,sVar2 * 0xc,pvVar3,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  (*glad_debug_glBindVertexArray)(DAT_003fb62c);
  (*glad_debug_glBindBuffer)(0x8892,verts._capacity._4_4_);
  i_1 = 8;
  j = 0x3b23d70a;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::resize<>
            ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,0);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::reserve
            ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28,0xaf0);
  for (local_e8[3] = 0; p_Var1 = glad_debug_glBufferData, local_e8[3] < 0x32;
      local_e8[3] = local_e8[3] + 1) {
    for (local_e8[2] = 1; local_e8[2] < 8; local_e8[2] = local_e8[2] + 1) {
      local_e8[1] = 0xffffffff;
      local_e8[0] = 0;
      local_ec = (float)local_e8[3] * -0.02 + -((float)local_e8[2] * 0.0025);
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)local_28,local_e8 + 1,local_e8,
                 &local_ec);
      local_f4[1] = 1;
      local_f4[0] = 0;
      local_f8 = (float)local_e8[3] * -0.02 + -((float)local_e8[2] * 0.0025);
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)local_28,local_f4 + 1,local_f4,
                 &local_f8);
      local_100[1] = 0xffffffff;
      local_100[0] = 0;
      local_104 = (float)local_e8[3] * 0.02 + (float)local_e8[2] * 0.0025;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)local_28,local_100 + 1,local_100,
                 &local_104);
      local_10c[1] = 1;
      local_10c[0] = 0;
      local_110 = (float)local_e8[3] * 0.02 + (float)local_e8[2] * 0.0025;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)local_28,local_10c + 1,local_10c,
                 &local_110);
      local_114 = (float)local_e8[3] * -0.02 + -((float)local_e8[2] * 0.0025);
      local_11c[1] = 0;
      local_11c[0] = -1;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)local_28,&local_114,local_11c + 1,
                 local_11c);
      local_120 = (float)local_e8[3] * -0.02 + -((float)local_e8[2] * 0.0025);
      local_128[1] = 0;
      local_128[0] = 1;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)local_28,&local_120,local_128 + 1,
                 local_128);
      local_12c = (float)local_e8[3] * 0.02 + (float)local_e8[2] * 0.0025;
      local_134[1] = 0;
      local_134[0] = -1;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)local_28,&local_12c,local_134 + 1,
                 local_134);
      local_138 = (float)local_e8[3] * 0.02 + (float)local_e8[2] * 0.0025;
      local_140[1] = 0;
      local_140[0] = 1;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)local_28,&local_138,local_140 + 1,
                 local_140);
    }
  }
  sVar2 = tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                    ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28);
  pvVar3 = tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::data
                     ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28);
  (*p_Var1)(0x8892,sVar2 * 0xc,pvVar3,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::~Vector
            ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_28);
  return;
}

Assistant:

void createFloorGridMesh()
{
    glGenVertexArrays(2, gpu::floorGridVao);
    u32 vbo[2];
    glGenBuffers(2, vbo);

    // thick lines
    glBindVertexArray(gpu::floorGridVao[0]);
    glBindBuffer(GL_ARRAY_BUFFER, vbo[0]);
    tl::Vector<vec3> verts;
    constexpr int n = FLOOR_GRID_RESOLUTION;
    verts.reserve(4 + 8*n);
    // fist the 2 lines that pass though the origin
    verts.push_back({-1, 0, 0});
    verts.push_back({+1, 0, 0});
    verts.push_back({0, 0, -1});
    verts.push_back({0, 0, +1});
    // the rest of the lines
    const float d = float(1) / n; // distance between lines
    for(int i = 1; i <= n; i++) {
        verts.push_back({-1, 0, -d*i});
        verts.push_back({+1, 0, -d*i});
        verts.push_back({-1, 0, +d*i});
        verts.push_back({+1, 0, +d*i});

        verts.push_back({-d*i, 0, -1});
        verts.push_back({-d*i, 0, +1});
        verts.push_back({+d*i, 0, -1});
        verts.push_back({+d*i, 0, +1});
    }
    glBufferData(GL_ARRAY_BUFFER, verts.size() * sizeof(vec3), verts.data(), GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, nullptr);

    // subdivisions
    glBindVertexArray(gpu::floorGridVao[1]);
    glBindBuffer(GL_ARRAY_BUFFER, vbo[1]);

    const int m = FLOOR_GRID_SUBDIVS;
    const float dd = d / m;
    verts.resize(0);
    verts.reserve(8*n*(m-1));
    for(int i = 0; i < n; i++)
    for(int j = 1; j < m; j++) {
        verts.emplace_back(-1, 0, -d*i - dd*j);
        verts.emplace_back(+1, 0, -d*i - dd*j);
        verts.emplace_back(-1, 0, +d*i + dd*j);
        verts.emplace_back(+1, 0, +d*i + dd*j);

        verts.emplace_back(-d*i - dd*j, 0, -1);
        verts.emplace_back(-d*i - dd*j, 0, +1);
        verts.emplace_back(+d*i + dd*j, 0, -1);
        verts.emplace_back(+d*i + dd*j, 0, +1);
    }
    glBufferData(GL_ARRAY_BUFFER, verts.size() * sizeof(vec3), verts.data(), GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, nullptr);
}